

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

google_protobuf_EnumValueDescriptorProto *
enumvaldef_toproto(upb_ToProto_Context *ctx,upb_EnumValueDef *e)

{
  upb_EnumValueDef *ctx_00;
  _Bool _Var1;
  int32_t value;
  google_protobuf_EnumValueDescriptorProto *pgVar2;
  char *pcVar3;
  google_protobuf_EnumValueOptions *pgVar4;
  google_protobuf_EnumValueOptions *dst;
  char *pb;
  size_t size;
  google_protobuf_EnumValueDescriptorProto *local_20;
  google_protobuf_EnumValueDescriptorProto *proto;
  upb_EnumValueDef *e_local;
  upb_ToProto_Context *ctx_local;
  
  proto = (google_protobuf_EnumValueDescriptorProto *)e;
  e_local = (upb_EnumValueDef *)ctx;
  pgVar2 = google_protobuf_EnumValueDescriptorProto_new(ctx->arena);
  ctx_00 = e_local;
  local_20 = pgVar2;
  if (pgVar2 == (google_protobuf_EnumValueDescriptorProto *)0x0) {
    longjmp((__jmp_buf_tag *)&e_local->resolved_features,1);
  }
  pcVar3 = upb_EnumValueDef_Name((upb_EnumValueDef *)proto);
  _size = strviewdup((upb_ToProto_Context *)ctx_00,pcVar3);
  google_protobuf_EnumValueDescriptorProto_set_name(pgVar2,_size);
  pgVar2 = local_20;
  value = upb_EnumValueDef_Number((upb_EnumValueDef *)proto);
  google_protobuf_EnumValueDescriptorProto_set_number(pgVar2,value);
  _Var1 = upb_EnumValueDef_HasOptions((upb_EnumValueDef *)proto);
  if (_Var1) {
    pgVar4 = upb_EnumValueDef_Options((upb_EnumValueDef *)proto);
    pcVar3 = google_protobuf_EnumValueOptions_serialize
                       (pgVar4,(upb_Arena *)e_local->opts,(size_t *)&pb);
    if (pcVar3 == (char *)0x0) {
      longjmp((__jmp_buf_tag *)&e_local->resolved_features,1);
    }
    pgVar4 = google_protobuf_EnumValueOptions_parse(pcVar3,(size_t)pb,(upb_Arena *)e_local->opts);
    if (pgVar4 == (google_protobuf_EnumValueOptions *)0x0) {
      longjmp((__jmp_buf_tag *)&e_local->resolved_features,1);
    }
    google_protobuf_EnumValueDescriptorProto_set_options(local_20,pgVar4);
  }
  return local_20;
}

Assistant:

static google_protobuf_EnumValueDescriptorProto* enumvaldef_toproto(
    upb_ToProto_Context* ctx, const upb_EnumValueDef* e) {
  google_protobuf_EnumValueDescriptorProto* proto =
      google_protobuf_EnumValueDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_EnumValueDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_EnumValueDef_Name(e)));
  google_protobuf_EnumValueDescriptorProto_set_number(proto, upb_EnumValueDef_Number(e));

  if (upb_EnumValueDef_HasOptions(e)) {
    SET_OPTIONS(proto, EnumValueDescriptorProto, EnumValueOptions,
                upb_EnumValueDef_Options(e));
  }

  return proto;
}